

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Minisat::SimpSolver::extendModel(SimpSolver *this)

{
  Lit index;
  bool bVar1;
  Size SVar2;
  int iVar3;
  uint *puVar4;
  lbool *plVar5;
  uchar *in_RCX;
  size_t *siglen;
  uchar *sig;
  size_t in_R8;
  lbool local_2d;
  int local_2c;
  uint8_t local_25;
  int local_24;
  lbool local_1d;
  Lit local_1c;
  uint local_18;
  Lit x;
  int j;
  int i;
  SimpSolver *this_local;
  
  SVar2 = vec<unsigned_int,_int>::size(&this->elimclauses);
  x.x = SVar2 + -1;
  do {
    index.x = x.x;
    if (x.x < 1) {
      return;
    }
    x.x = x.x + -1;
    puVar4 = vec<unsigned_int,_int>::operator[](&this->elimclauses,index.x);
    for (local_18 = *puVar4; 1 < (int)local_18; local_18 = local_18 - 1) {
      puVar4 = vec<unsigned_int,_int>::operator[](&this->elimclauses,x.x);
      local_24 = (int)toLit(*puVar4);
      local_1d = Solver::modelValue(&this->super_Solver,(Lit)local_24);
      local_25 = l_False.value;
      bVar1 = lbool::operator!=(&local_1d,l_False);
      if (bVar1) goto LAB_0011e975;
      x.x = x.x + -1;
    }
    sig = (uchar *)(ulong)(uint)x.x;
    puVar4 = vec<unsigned_int,_int>::operator[](&this->elimclauses,x.x);
    local_2c = (int)toLit(*puVar4);
    local_1c = (Lit)local_2c;
    iVar3 = sign((EVP_PKEY_CTX *)(ulong)(uint)local_2c,sig,siglen,in_RCX,in_R8);
    lbool::lbool(&local_2d,(bool)(((byte)iVar3 ^ 0xff) & 1));
    iVar3 = var(local_1c);
    plVar5 = vec<Minisat::lbool,_int>::operator[](&(this->super_Solver).model,iVar3);
    plVar5->value = local_2d.value;
LAB_0011e975:
    in_RCX = (uchar *)(ulong)local_18;
    x.x = x.x - local_18;
  } while( true );
}

Assistant:

void SimpSolver::extendModel()
{
    int i, j;
    Lit x;

    for (i = elimclauses.size()-1; i > 0; i -= j){
        for (j = elimclauses[i--]; j > 1; j--, i--)
            if (modelValue(toLit(elimclauses[i])) != l_False)
                goto next;

        x = toLit(elimclauses[i]);
        model[var(x)] = lbool(!sign(x));
    next:;
    }
}